

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

TestCase * TestCharReaderStrictModeTestdupKeys::factory(void)

{
  TestCase *this;
  
  this = (TestCase *)operator_new(0x10);
  this->_vptr_TestCase = (_func_int **)0x0;
  this->result_ = (TestResult *)0x0;
  JsonTest::TestCase::TestCase(this);
  this->_vptr_TestCase = (_func_int **)&PTR__TestCase_0015f5a8;
  return this;
}

Assistant:

JSONTEST_FIXTURE(CharReaderStrictModeTest, dupKeys) {
  Json::CharReaderBuilder b;
  Json::Value root;
  char const doc[] =
      "{ \"property\" : \"value\", \"key\" : \"val1\", \"key\" : \"val2\" }";
  {
    b.strictMode(&b.settings_);
    Json::CharReader* reader(b.newCharReader());
    std::string errs;
    bool ok = reader->parse(
        doc, doc + std::strlen(doc),
        &root, &errs);
    JSONTEST_ASSERT(!ok);
    JSONTEST_ASSERT_STRING_EQUAL(
        "* Line 1, Column 41\n"
        "  Duplicate key: 'key'\n",
        errs);
    JSONTEST_ASSERT_EQUAL("val1", root["key"]); // so far
    delete reader;
  }
}